

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPruning.cpp
# Opt level: O0

bool AlphaVectorPruning::FindBelief
               (AlphaVector *p,ValueFunctionPOMDPDiscrete *uU,
               vector<double,_std::allocator<double>_> *belief,size_t acceleratedPruningThreshold)

{
  bool bVar1;
  size_type sVar2;
  ulong in_RCX;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if ((in_RCX != 0) &&
     (sVar2 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(in_RSI), in_RCX <= sVar2)
     ) {
    bVar1 = FindBeliefAccelerated
                      ((AlphaVector *)acceleratedPruningThreshold,
                       (ValueFunctionPOMDPDiscrete *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI);
    return bVar1;
  }
  bVar1 = FindBeliefNormal((AlphaVector *)acceleratedPruningThreshold,
                           (ValueFunctionPOMDPDiscrete *)
                           CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI);
  return bVar1;
}

Assistant:

bool AlphaVectorPruning::FindBelief(const AlphaVector &p,
                                    const ValueFunctionPOMDPDiscrete &uU,
                                    vector<double> &belief,
                                    size_t acceleratedPruningThreshold)
{
    // if the threshold is set to 0, accelerated pruning is disabled
    if(acceleratedPruningThreshold==0 ||
       uU.size() < acceleratedPruningThreshold)
    {
        return FindBeliefNormal(p, uU, belief);
    }
    else
    {
        return FindBeliefAccelerated(p, uU, belief);
    }
}